

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O1

iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
burst::bitap<std::bitset<32ul>,std::__cxx11::string,std::__cxx11::string>
          (iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,burst *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_> bitap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _WordT local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  algorithm::bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>>::
  bitap<std::__cxx11::string>
            ((bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>> *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_c8 = local_88;
  local_c0 = local_80;
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_80->_M_use_count = local_80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_80->_M_use_count = local_80->_M_use_count + 1;
    }
  }
  make_bitap_iterator<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>,std::__cxx11::string>
            (&local_b8,(burst *)&local_c8,
             (bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_> *)pattern,
             local_88);
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  this_00._M_pi =
       local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_b8.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_78 = local_b8.m_bitap.m_bitmask_table.
             super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_70 = local_b8.m_bitap.m_bitmask_table.
             super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  if (local_b8.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_58 = local_b8.m_match.
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
             .m_End._M_current;
  pcStack_50 = local_b8.m_text_end._M_current;
  local_68 = (_WordT)local_b8.m_hint.super__Base_bitset<1UL>._M_w;
  pcStack_60 = local_b8.m_match.
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_current;
  local_48.m_bitap.m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_48.m_bitap.m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_b8.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_b8.m_bitap.m_bitmask_table.
    super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.m_hint.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  local_48.m_match.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_b8.m_text_end._M_current;
  local_48.m_match.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_b8.m_text_end._M_current;
  local_48.m_text_end._M_current = local_b8.m_text_end._M_current;
  boost::
  make_iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>>,std::__cxx11::string>>
            (__return_storage_ptr__,(boost *)&local_78,&local_48,
             (bitap_iterator<burst::algorithm::bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b8.m_bitap.m_bitmask_table.
                super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr);
  if (local_48.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.m_bitap.m_bitmask_table.
               super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (local_b8.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.m_bitap.m_bitmask_table.
               super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

auto bitap (const ForwardRange1 & pattern, const ForwardRange2 & text)
    {
        auto bitap = algorithm::make_bitap<Bitmask>(pattern);
        auto begin = make_bitap_iterator(std::move(bitap), text);
        auto end = make_bitap_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }